

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGetPropertyCommand.cxx
# Opt level: O2

bool __thiscall cmGetPropertyCommand::HandleVariableMode(cmGetPropertyCommand *this)

{
  size_type sVar1;
  char *value;
  allocator<char> local_39;
  string local_38;
  
  sVar1 = (this->Name)._M_string_length;
  if (sVar1 == 0) {
    value = cmMakefile::GetDefinition((this->super_cmCommand).Makefile,&this->PropertyName);
    StoreResult(this,value);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"given name for VARIABLE scope.",&local_39);
    cmCommand::SetError(&this->super_cmCommand,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return sVar1 == 0;
}

Assistant:

bool cmGetPropertyCommand::HandleVariableMode()
{
  if (!this->Name.empty()) {
    this->SetError("given name for VARIABLE scope.");
    return false;
  }

  return this->StoreResult(this->Makefile->GetDefinition(this->PropertyName));
}